

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O2

nametree_entry_t * ndn_nametree_find(ndn_nametree_t *nametree,uint8_t *name,size_t len)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  
  if (1 < len) {
    uVar4 = (ulong)(0xfc < name[1]) * 2 + 2;
    uVar5 = 0;
    do {
      if (len <= uVar4) {
        return (nametree_entry_t *)(nametree + uVar5 * 0x2e);
      }
      uVar3 = (ulong)name[uVar4 + 1] + 2;
      __n = 0x24;
      if (uVar3 < 0x24) {
        __n = uVar3;
      }
      lVar1 = uVar5 * 0x2e + 0x26;
      do {
        uVar5 = (ulong)*(ushort *)(nametree + lVar1);
        if (uVar5 == 0xffff) {
          return (nametree_entry_t *)0x0;
        }
        iVar2 = memcmp(name + uVar4,nametree + uVar5 * 0x2e,__n);
        lVar1 = uVar5 * 0x2e + 0x28;
      } while (0 < iVar2);
      uVar4 = uVar4 + uVar3;
    } while (iVar2 == 0);
  }
  return (nametree_entry_t *)0x0;
}

Assistant:

nametree_entry_t*
ndn_nametree_find(ndn_nametree_t *nametree, uint8_t name[], size_t len)
{
  int now_node, father = 0 , tmp;
  size_t component_len, eqiv_component_len, offset = 0;
  // TODO: Put it into decoder
  if (len < 2) return NULL;
  if (name[1] < 253) offset = 2; else offset = 4;
  while (offset < len) {
    component_len = name[offset + 1] + 2;
    eqiv_component_len = minof2(component_len, NDN_NAME_COMPONENT_BUFFER_SIZE);
    now_node = (*nametree)[father].left_child;
    tmp = -2;
    while (now_node != NDN_INVALID_ID) {
      tmp = memcmp(name+offset, (*nametree)[now_node].val , eqiv_component_len);
      if (tmp <= 0) break;
      now_node = (*nametree)[now_node].right_bro;
    }
    if (tmp != 0) {
      return NULL;
    }
    offset += component_len;
    father = now_node;
  }
  return &(*nametree)[father];
}